

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spvc_entry_point,_8UL> * __thiscall
spirv_cross::SmallVector<spvc_entry_point,_8UL>::operator=
          (SmallVector<spvc_entry_point,_8UL> *this,SmallVector<spvc_entry_point,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  spvc_entry_point *__ptr;
  ulong uVar3;
  size_t sVar4;
  undefined8 uVar5;
  spvc_entry_point *psVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  
  (this->super_VectorView<spvc_entry_point>).buffer_size = 0;
  psVar6 = (other->super_VectorView<spvc_entry_point>).ptr;
  if (psVar6 == (spvc_entry_point *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spvc_entry_point>).buffer_size);
    lVar7 = 0;
    for (uVar8 = 0; uVar3 = (other->super_VectorView<spvc_entry_point>).buffer_size, uVar8 < uVar3;
        uVar8 = uVar8 + 1) {
      puVar1 = (undefined8 *)
               ((long)&((other->super_VectorView<spvc_entry_point>).ptr)->execution_model + lVar7);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&((this->super_VectorView<spvc_entry_point>).ptr)->execution_model + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar7 = lVar7 + 0x10;
    }
    (this->super_VectorView<spvc_entry_point>).buffer_size = uVar3;
    (other->super_VectorView<spvc_entry_point>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<spvc_entry_point>).ptr;
    if (__ptr != (spvc_entry_point *)&this->stack_storage) {
      free(__ptr);
      psVar6 = (other->super_VectorView<spvc_entry_point>).ptr;
    }
    (this->super_VectorView<spvc_entry_point>).ptr = psVar6;
    sVar4 = other->buffer_capacity;
    (this->super_VectorView<spvc_entry_point>).buffer_size =
         (other->super_VectorView<spvc_entry_point>).buffer_size;
    this->buffer_capacity = sVar4;
    (other->super_VectorView<spvc_entry_point>).ptr = (spvc_entry_point *)0x0;
    (other->super_VectorView<spvc_entry_point>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}